

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Node * prvTidyFindTITLE(TidyDocImpl *doc)

{
  Node *pNVar1;
  
  pNVar1 = prvTidyFindHEAD(doc);
  if (pNVar1 != (Node *)0x0) {
    for (pNVar1 = pNVar1->content; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next) {
      if ((pNVar1->tag != (Dict *)0x0) && (pNVar1->tag->id == TidyTag_TITLE)) {
        return pNVar1;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *TY_(FindTITLE)(TidyDocImpl* doc)
{
    Node *node = TY_(FindHEAD)(doc);

    if (node)
        for (node = node->content;
             node && !nodeIsTITLE(node);
             node = node->next) {}

    return node;
}